

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float32_eq_riscv64(float32 a,float32 b,float_status *status)

{
  float32 fVar1;
  float32 fVar2;
  uint uVar3;
  
  fVar1 = float32_squash_input_denormal_riscv64(a,status);
  fVar2 = float32_squash_input_denormal_riscv64(b,status);
  if (((~fVar1 & 0x7f800000) == 0 && (fVar1 & 0x7fffff) != 0) ||
     ((fVar2 & 0x7fffff) != 0 && (~fVar2 & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)(((fVar2 | fVar1) & 0x7fffffff) == 0 || fVar1 == fVar2);
  }
  return uVar3;
}

Assistant:

int float32_eq(float32 a, float32 b, float_status *status)
{
    uint32_t av, bv;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    av = float32_val(a);
    bv = float32_val(b);
    return ( av == bv ) || ( (uint32_t) ( ( av | bv )<<1 ) == 0 );
}